

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_result_modifier.cpp
# Opt level: O1

unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
__thiscall
duckdb::BoundOrderModifier::Deserialize(BoundOrderModifier *this,Deserializer *deserializer)

{
  BoundOrderModifier *this_00;
  pointer pBVar1;
  pointer *__ptr;
  
  this_00 = (BoundOrderModifier *)operator_new(0x28);
  BoundOrderModifier(this_00);
  (this->super_BoundResultModifier)._vptr_BoundResultModifier = (_func_int **)this_00;
  pBVar1 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
           ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                         *)this);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::BoundOrderByNode,true>>
            (deserializer,100,"orders",&pBVar1->orders);
  return (unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>)
         (unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>)
         this;
}

Assistant:

unique_ptr<BoundOrderModifier> BoundOrderModifier::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BoundOrderModifier>(new BoundOrderModifier());
	deserializer.ReadPropertyWithDefault<vector<BoundOrderByNode>>(100, "orders", result->orders);
	return result;
}